

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

bool __thiscall
ConsistencyChecker::checkVarnodeTruncation
          (ConsistencyChecker *this,Constructor *ct,int4 slot,OpTpl *op,VarnodeTpl *vn,
          bool isbigendian)

{
  VarnodeTpl *pVVar1;
  int4 iVar2;
  Constructor *pCVar3;
  const_type cVar4;
  v_field vVar5;
  ConstTpl *this_00;
  allocator local_d1;
  string local_d0 [38];
  byte local_aa;
  allocator local_a9;
  string local_a8 [6];
  bool res;
  int4 local_88;
  int4 sz;
  allocator local_71;
  string local_70 [36];
  const_type local_4c;
  ConstTpl *pCStack_48;
  const_type sztype;
  ConstTpl *off;
  VarnodeTpl *pVStack_38;
  bool isbigendian_local;
  VarnodeTpl *vn_local;
  OpTpl *op_local;
  Constructor *pCStack_20;
  int4 slot_local;
  Constructor *ct_local;
  ConsistencyChecker *this_local;
  
  off._7_1_ = isbigendian;
  pVStack_38 = vn;
  vn_local = (VarnodeTpl *)op;
  op_local._4_4_ = slot;
  pCStack_20 = ct;
  ct_local = (Constructor *)this;
  pCStack_48 = VarnodeTpl::getOffset(vn);
  cVar4 = ConstTpl::getType(pCStack_48);
  if (cVar4 == handle) {
    vVar5 = ConstTpl::getSelect(pCStack_48);
    if (vVar5 == v_offset_plus) {
      this_00 = VarnodeTpl::getSize(pVStack_38);
      local_4c = ConstTpl::getType(this_00);
      pCVar3 = pCStack_20;
      iVar2 = op_local._4_4_;
      pVVar1 = vn_local;
      if ((local_4c == real) || (local_4c == handle)) {
        local_88 = recoverSize(this,pCStack_48,pCStack_20);
        pCVar3 = pCStack_20;
        iVar2 = op_local._4_4_;
        pVVar1 = vn_local;
        if (local_88 < 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"Could not recover size",&local_a9);
          printOpError(this,(OpTpl *)pVVar1,pCVar3,iVar2,iVar2,(string *)local_a8);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          this_local._7_1_ = false;
        }
        else {
          local_aa = VarnodeTpl::adjustTruncation((int)pVStack_38,SUB41(local_88,0));
          pCVar3 = pCStack_20;
          iVar2 = op_local._4_4_;
          pVVar1 = vn_local;
          local_aa = local_aa & 1;
          if (local_aa == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d0,"Truncation operator out of bounds",&local_d1);
            printOpError(this,(OpTpl *)pVVar1,pCVar3,iVar2,iVar2,(string *)local_d0);
            std::__cxx11::string::~string(local_d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_d1);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"Bad truncation expression",&local_71);
        printOpError(this,(OpTpl *)pVVar1,pCVar3,iVar2,iVar2,(string *)local_70);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsistencyChecker::checkVarnodeTruncation(Constructor *ct,int4 slot,
						OpTpl *op,VarnodeTpl *vn,bool isbigendian)
{
  const ConstTpl &off( vn->getOffset() );
  if (off.getType() != ConstTpl::handle) return true;
  if (off.getSelect() != ConstTpl::v_offset_plus) return true;
  ConstTpl::const_type sztype = vn->getSize().getType();
  if ((sztype != ConstTpl::real)&&(sztype != ConstTpl::handle)) {
    printOpError(op,ct,slot,slot,"Bad truncation expression");
    return false;
  }
  int4 sz = recoverSize(off,ct); // Recover the size of the original operand
  if (sz <= 0) {
    printOpError(op,ct,slot,slot,"Could not recover size");
    return false;
  }
  bool res = vn->adjustTruncation(sz,isbigendian);
  if (!res) {
    printOpError(op,ct,slot,slot,"Truncation operator out of bounds");
    return false;
  }
  return true;
}